

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_linear_resampler_get_heap_layout
                    (ma_linear_resampler_config *pConfig,
                    ma_linear_resampler_heap_layout *pHeapLayout)

{
  ma_result mVar1;
  ulong uVar2;
  size_t sVar3;
  size_t lpfHeapSizeInBytes;
  ma_lpf_config lpfConfig;
  
  if (pHeapLayout != (ma_linear_resampler_heap_layout *)0x0) {
    pHeapLayout->x1Offset = 0;
    pHeapLayout->lpfOffset = 0;
    pHeapLayout->sizeInBytes = 0;
    pHeapLayout->x0Offset = 0;
    mVar1 = MA_INVALID_ARGS;
    if ((pConfig != (ma_linear_resampler_config *)0x0) &&
       ((lpfConfig.format = pConfig->format, lpfConfig.format == ma_format_f32 ||
        (lpfConfig.format == ma_format_s16)))) {
      lpfConfig.channels = pConfig->channels;
      uVar2 = (ulong)lpfConfig.channels;
      if (uVar2 != 0) {
        pHeapLayout->x0Offset = 0;
        sVar3 = uVar2 << (lpfConfig.format == ma_format_f32 | 2U);
        pHeapLayout->x1Offset = uVar2 << (lpfConfig.format == ma_format_f32) + 1;
        pHeapLayout->sizeInBytes = sVar3;
        pHeapLayout->lpfOffset = sVar3 + 7 & 0xfffffffffffffff8;
        lpfConfig.sampleRate = 1;
        lpfConfig._12_4_ = 0;
        lpfConfig.cutoffFrequency = 1.0;
        lpfConfig.order = 8;
        if (pConfig->lpfOrder < 8) {
          lpfConfig.order = pConfig->lpfOrder;
        }
        lpfConfig._28_4_ = 0;
        mVar1 = ma_lpf_get_heap_size(&lpfConfig,&lpfHeapSizeInBytes);
        if (mVar1 == MA_SUCCESS) {
          pHeapLayout->sizeInBytes =
               lpfHeapSizeInBytes + pHeapLayout->sizeInBytes + 7 & 0xfffffffffffffff8;
          mVar1 = MA_SUCCESS;
        }
      }
    }
    return mVar1;
  }
  __assert_fail("pHeapLayout != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x966f,
                "ma_result ma_linear_resampler_get_heap_layout(const ma_linear_resampler_config *, ma_linear_resampler_heap_layout *)"
               );
}

Assistant:

static ma_result ma_linear_resampler_get_heap_layout(const ma_linear_resampler_config* pConfig, ma_linear_resampler_heap_layout* pHeapLayout)
{
    MA_ASSERT(pHeapLayout != NULL);

    MA_ZERO_OBJECT(pHeapLayout);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->channels == 0) {
        return MA_INVALID_ARGS;
    }

    pHeapLayout->sizeInBytes = 0;

    /* x0 */
    pHeapLayout->x0Offset = pHeapLayout->sizeInBytes;
    if (pConfig->format == ma_format_f32) {
        pHeapLayout->sizeInBytes += sizeof(float) * pConfig->channels;
    } else {
        pHeapLayout->sizeInBytes += sizeof(ma_int16) * pConfig->channels;
    }

    /* x1 */
    pHeapLayout->x1Offset = pHeapLayout->sizeInBytes;
    if (pConfig->format == ma_format_f32) {
        pHeapLayout->sizeInBytes += sizeof(float) * pConfig->channels;
    } else {
        pHeapLayout->sizeInBytes += sizeof(ma_int16) * pConfig->channels;
    }

    /* LPF */
    pHeapLayout->lpfOffset = ma_align_64(pHeapLayout->sizeInBytes);
    {
        ma_result result;
        size_t lpfHeapSizeInBytes;
        ma_lpf_config lpfConfig = ma_lpf_config_init(pConfig->format, pConfig->channels, 1, 1, pConfig->lpfOrder);  /* Sample rate and cutoff frequency do not matter. */

        result = ma_lpf_get_heap_size(&lpfConfig, &lpfHeapSizeInBytes);
        if (result != MA_SUCCESS) {
            return result;
        }

        pHeapLayout->sizeInBytes += lpfHeapSizeInBytes;
    }

    /* Make sure allocation size is aligned. */
    pHeapLayout->sizeInBytes = ma_align_64(pHeapLayout->sizeInBytes);

    return MA_SUCCESS;
}